

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BasicTexSubImage3DCase::createTexture(BasicTexSubImage3DCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *format;
  float fVar1;
  float fVar2;
  TransferFormat TVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  byte bVar7;
  int iVar8;
  int ndx;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int depth;
  int ndx_2;
  int iVar13;
  uint uVar14;
  float fVar15;
  uint local_f8;
  deUint32 tex;
  TransferFormat local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  TextureLevel data;
  PixelBufferAccess local_58;
  
  tex = 0;
  format = &(this->super_Texture3DSpecCase).m_texFormat;
  tcu::TextureLevel::TextureLevel(&data,format);
  dVar4 = deStringHash((this->super_Texture3DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  local_e0 = glu::getTransferFormat(*format);
  this_00 = &(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x806f,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  TVar3 = local_e0;
  if (0 < (this->super_Texture3DSpecCase).m_numLevels) {
    iVar13 = 0;
    do {
      bVar7 = (byte)iVar13;
      iVar8 = (this->super_Texture3DSpecCase).m_width >> (bVar7 & 0x1f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      iVar11 = (this->super_Texture3DSpecCase).m_height >> (bVar7 & 0x1f);
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      depth = (this->super_Texture3DSpecCase).m_depth >> (bVar7 & 0x1f);
      if (depth < 2) {
        depth = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar10 = 0;
      do {
        fVar1 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
        fVar2 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
        fVar15 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar10] = (fVar2 - fVar1) * fVar15 + fVar1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar10 = 0;
      do {
        fVar1 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
        fVar2 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
        fVar15 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar10] = (fVar2 - fVar1) * fVar15 + fVar1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      tcu::TextureLevel::setSize(&data,iVar8,iVar11,depth);
      tcu::TextureLevel::getAccess(&local_58,&data);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      dVar4 = this->m_internalFormat;
      tcu::TextureLevel::getAccess(&local_58,&data);
      sglr::ContextWrapper::glTexImage3D
                (this_00,0x806f,iVar13,dVar4,iVar8,iVar11,depth,0,local_e0.format,TVar3.dataType,
                 local_58.super_ConstPixelBufferAccess.m_data);
      iVar13 = iVar13 + 1;
      iVar8 = (this->super_Texture3DSpecCase).m_numLevels;
    } while (iVar13 < iVar8);
    if (0 < iVar8) {
      iVar13 = 0;
      do {
        bVar7 = (byte)iVar13;
        uVar12 = (this->super_Texture3DSpecCase).m_width >> (bVar7 & 0x1f);
        if ((int)uVar12 < 2) {
          uVar12 = 1;
        }
        uVar14 = (this->super_Texture3DSpecCase).m_height >> (bVar7 & 0x1f);
        if ((int)uVar14 < 2) {
          uVar14 = 1;
        }
        uVar9 = (this->super_Texture3DSpecCase).m_depth >> (bVar7 & 0x1f);
        if ((int)uVar9 < 2) {
          uVar9 = 1;
        }
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        local_f8 = dVar4 % uVar12;
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        local_cc = dVar6 % (uVar12 - local_f8);
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        local_d0 = dVar6 % (uVar14 - dVar4 % uVar14);
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        iVar8 = dVar4 % uVar14 + 1;
        iVar11 = dVar5 % uVar9 + 1;
        local_d4 = dVar6 % (uVar9 - dVar5 % uVar9);
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          fVar1 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
          fVar2 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
          fVar15 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar10] = (fVar2 - fVar1) * fVar15 + fVar1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          fVar1 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
          fVar2 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
          fVar15 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar10] = (fVar2 - fVar1) * fVar15 + fVar1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        tcu::TextureLevel::setSize(&data,local_f8 + 1,iVar8,iVar11);
        tcu::TextureLevel::getAccess(&local_58,&data);
        tcu::fillWithGrid(&local_58,dVar4 % 0xf + 2,&gMin,&gMax);
        tcu::TextureLevel::getAccess(&local_58,&data);
        sglr::ContextWrapper::glTexSubImage3D
                  (this_00,0x806f,iVar13,local_cc,local_d0,local_d4,local_f8 + 1,iVar8,iVar11,
                   local_e0.format,TVar3.dataType,local_58.super_ConstPixelBufferAccess.m_data);
        iVar13 = iVar13 + 1;
      } while (iVar13 < (this->super_Texture3DSpecCase).m_numLevels);
    }
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex				= 0;
		tcu::TextureLevel		data			(m_texFormat);
		de::Random				rnd				(deStringHash(getName()));
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		levelD		= de::max(1, m_depth >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			data.setSize(levelW, levelH, levelD);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_3D, ndx, m_internalFormat, levelW, levelH, levelD, 0, transferFmt.format, transferFmt.dataType, data.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		levelD		= de::max(1, m_depth >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		d			= rnd.getInt(1, levelD);
			int		x			= rnd.getInt(0, levelW-w);
			int		y			= rnd.getInt(0, levelH-h);
			int		z			= rnd.getInt(0, levelD-d);

			Vec4	colorA		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	colorB		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(w, h, d);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_3D, ndx, x, y, z, w, h, d, transferFmt.format, transferFmt.dataType, data.getAccess().getDataPtr());
		}
	}